

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O2

char_type_conflict __thiscall toml::detail::location::current(location *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  const_reference pvVar1;
  
  this_00 = (this->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this->location_ <
      (ulong)((long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,this->location_)
    ;
    return *pvVar1;
  }
  return '\0';
}

Assistant:

TOML11_INLINE location::char_type location::current() const
{
    assert(this->is_ok());
    if(this->eof()) {return '\0';}

    assert(this->location_ < this->source_->size());
    return this->source_->at(this->location_);
}